

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O0

void __thiscall
libtorrent::piece_availability_alert::~piece_availability_alert(piece_availability_alert *this)

{
  piece_availability_alert *this_local;
  
  ~piece_availability_alert(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

struct TORRENT_EXPORT piece_availability_alert final : torrent_alert
	{
		// internal
		TORRENT_UNEXPORT piece_availability_alert(aux::stack_allocator& alloc, torrent_handle h
			, std::vector<int> pa);
		TORRENT_DEFINE_ALERT_PRIO(piece_availability_alert, 103, alert_priority::critical)

		static constexpr alert_category_t static_category = alert_category::status;
		std::string message() const override;

		// info about pieces being downloaded for the torrent
		std::vector<int> piece_availability;
	}